

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O3

int MetaSim::GnuPlotOutput::init(EVP_PKEY_CTX *ctx)

{
  long lVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  BaseExc *this;
  undefined8 *puVar6;
  ofstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined8 local_298;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  long local_228;
  long local_220 [29];
  ios_base local_138 [264];
  
  plVar2 = _VTT;
  if ((undefined8 **)BaseStat::_statList_abi_cxx11_ != &BaseStat::_statList_abi_cxx11_) {
    local_298 = _log;
    puVar6 = BaseStat::_statList_abi_cxx11_;
    do {
      lVar1 = puVar6[2];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name: ",6);
      local_230 = local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,*(long *)(lVar1 + 8),
                 *(long *)(lVar1 + 0x10) + *(long *)(lVar1 + 8));
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_230,local_228);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_230 != local_220) {
        operator_delete(local_230,local_220[0] + 1);
      }
      local_230 = local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,*(long *)(lVar1 + 8),
                 *(long *)(lVar1 + 0x10) + *(long *)(lVar1 + 8));
      iVar4 = std::__cxx11::string::compare((char *)&local_230);
      if (local_230 != local_220) {
        operator_delete(local_230,local_220[0] + 1);
      }
      if (iVar4 != 0) {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,*(long *)(lVar1 + 8),
                   *(long *)(lVar1 + 0x10) + *(long *)(lVar1 + 8));
        std::ofstream::ofstream((ostream *)&local_230,local_2b8._M_dataplus._M_p,_S_out);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          this = (BaseExc *)__cxa_allocate_exception(0x30);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,*(long *)(lVar1 + 8),
                     *(long *)(lVar1 + 0x10) + *(long *)(lVar1 + 8));
          std::operator+(&local_250,"Cannot open file ",&local_2b8);
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"GnuPlotOutput","");
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"basestat.hpp","");
          BaseExc::BaseExc(this,&local_250,&local_270,&local_290);
          *(undefined ***)this = &PTR__BaseExc_00124820;
          __cxa_throw(this,&Exc::typeinfo,BaseExc::~BaseExc);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,*(long *)(lVar1 + 8),
                   *(long *)(lVar1 + 0x10) + *(long *)(lVar1 + 8));
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_2b8._M_dataplus._M_p,
                            local_2b8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        local_230 = plVar2;
        *(undefined8 *)((long)&local_230 + plVar2[-3]) = local_298;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_138);
      }
      puVar6 = (undefined8 *)*puVar6;
    } while ((undefined8 **)puVar6 != &BaseStat::_statList_abi_cxx11_);
  }
  return 0x138c28;
}

Assistant:

void GnuPlotOutput::init()
    {
        BaseStat::List::const_iterator i  = BaseStat::begin();
        while (i != BaseStat::end()) {
            BaseStat* p = *i;
            cout << "Name: " << p->getName() << endl;

            if (p->getName() != "") {
                ofstream f(p->getName().c_str());

                if (!f.is_open())
                    throw Exc("Cannot open file " + p->getName());

                f << "# " << p->getName() << endl;
            }
            ++i;
        }
    }